

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::skip_content_with_length(Stream *strm,uint64_t len)

{
  long *plVar1;
  unsigned_long *puVar2;
  ulong in_RSI;
  long *in_RDI;
  int n;
  size_t read_len;
  uint64_t r;
  char buf [4096];
  unsigned_long local_1038;
  int local_102c;
  unsigned_long local_1028;
  ulong local_1020;
  undefined1 local_1018 [4104];
  ulong local_10;
  long *local_8;
  
  local_1020 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    plVar1 = local_8;
    if (local_10 <= local_1020) {
      return;
    }
    local_1028 = local_10 - local_1020;
    local_1038 = 0x1000;
    puVar2 = std::min<unsigned_long>(&local_1028,&local_1038);
    local_102c = (**(code **)(*plVar1 + 0x10))(plVar1,local_1018,*puVar2);
    if (local_102c < 1) break;
    local_1020 = (long)local_102c + local_1020;
  }
  return;
}

Assistant:

inline void skip_content_with_length(Stream &strm, uint64_t len) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];
  uint64_t r = 0;
  while (r < len) {
    auto read_len = static_cast<size_t>(len - r);
    auto n = strm.read(buf, std::min(read_len, CPPHTTPLIB_RECV_BUFSIZ));
    if (n <= 0) { return; }
    r += n;
  }
}